

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManReader.cpp
# Opt level: O0

void __thiscall adios2::core::engine::DataManReader::RequestThread(DataManReader *this)

{
  bool bVar1;
  element_type *peVar2;
  size_type sVar3;
  VecPtr *in_RDI;
  unsigned_long *timeStamp;
  iterator __end5;
  iterator __begin5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> timeStamps;
  size_t combiningSteps;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  jmsg;
  shared_ptr<std::vector<char,_std::allocator<char>_>_> buffer;
  string request;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffeb8;
  function<bool_(int,_nlohmann::detail::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
  *in_stack_fffffffffffffec0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *in_stack_fffffffffffffec8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffed0;
  DataManSerializer *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  allocator *paVar4;
  undefined1 useThread;
  DataManSerializer *in_stack_ffffffffffffff20;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_d0;
  undefined1 *local_c8;
  undefined1 local_c0 [24];
  function<bool_(int,_nlohmann::detail::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
  *local_a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a0;
  undefined1 local_88 [16];
  char *in_stack_ffffffffffffff88;
  json_value in_stack_ffffffffffffff90;
  ZmqReqRep *in_stack_ffffffffffffff98;
  string local_28 [22];
  undefined1 in_stack_ffffffffffffffee;
  undefined1 in_stack_ffffffffffffffef;
  undefined8 in_stack_fffffffffffffff0;
  undefined8 i;
  
  i = in_RDI;
  do {
    bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffec8);
    if (!bVar1) {
      return;
    }
    paVar4 = (allocator *)&stack0xffffffffffffffd7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_28,"Step",paVar4);
    useThread = (undefined1)((ulong)paVar4 >> 0x38);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd7);
    std::__cxx11::string::data();
    std::__cxx11::string::size();
    zmq::ZmqReqRep::Request
              (in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffff90.object,
               (size_t)in_stack_ffffffffffffff88);
    bVar1 = std::operator!=((shared_ptr<std::vector<char,_std::allocator<char>_>_> *)
                            in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    if (bVar1) {
      peVar2 = std::
               __shared_ptr_access<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0xe15fa4);
      sVar3 = std::vector<char,_std::allocator<char>_>::size(peVar2);
      if (sVar3 == 0) goto LAB_00e16334;
      peVar2 = std::
               __shared_ptr_access<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0xe15fc3);
      sVar3 = std::vector<char,_std::allocator<char>_>::size(peVar2);
      if (0x3f < sVar3) {
        in_stack_fffffffffffffec8 =
             &in_RDI[0x14].
              super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount;
        in_stack_fffffffffffffed0 = &local_a0;
        std::shared_ptr<std::vector<char,_std::allocator<char>_>_>::shared_ptr
                  ((shared_ptr<std::vector<char,_std::allocator<char>_>_> *)
                   in_stack_fffffffffffffec0,
                   (shared_ptr<std::vector<char,_std::allocator<char>_>_> *)
                   in_stack_fffffffffffffeb8);
        adios2::format::DataManSerializer::PutPack(in_stack_ffffffffffffff20,in_RDI,(bool)useThread)
        ;
        std::shared_ptr<std::vector<char,_std::allocator<char>_>_>::~shared_ptr
                  ((shared_ptr<std::vector<char,_std::allocator<char>_>_> *)0xe161a9);
        if (((ulong)in_RDI[0x11].
                    super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi & 1) != 0) {
          in_stack_fffffffffffffec0 =
               (function<bool_(int,_nlohmann::detail::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
                *)adios2::format::DataManSerializer::GetCombiningSteps
                            ((DataManSerializer *)
                             &in_RDI[0x14].
                              super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
          local_a8 = in_stack_fffffffffffffec0;
          DataManMonitor::SetCombiningSteps
                    ((DataManMonitor *)(in_RDI + 0x42),(size_t)in_stack_fffffffffffffec0);
          if (local_a8 <
              (function<bool_(int,_nlohmann::detail::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
               *)0x14) {
            DataManMonitor::SetAverageSteps((DataManMonitor *)(in_RDI + 0x42),0x28);
          }
          else {
            DataManMonitor::SetAverageSteps((DataManMonitor *)(in_RDI + 0x42),(long)local_a8 * 2);
          }
          adios2::format::DataManSerializer::GetTimeStamps(in_stack_fffffffffffffee8);
          local_c8 = local_c0;
          local_d0._M_current =
               (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                         (in_stack_fffffffffffffeb8);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(in_stack_fffffffffffffeb8)
          ;
          while (bVar1 = __gnu_cxx::operator!=
                                   ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                     *)in_stack_fffffffffffffec0,
                                    (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                     *)in_stack_fffffffffffffeb8), bVar1) {
            in_stack_ffffffffffffff20 =
                 (DataManSerializer *)
                 __gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&local_d0);
            DataManMonitor::AddLatencyMilliseconds
                      ((DataManMonitor *)
                       CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                       (uint64_t)in_stack_fffffffffffffee8);
            __gnu_cxx::
            __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            ::operator++(&local_d0);
          }
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                    (in_stack_fffffffffffffed0);
        }
        goto LAB_00e16334;
      }
      std::
      __shared_ptr_access<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0xe15fe2);
      in_stack_ffffffffffffff98 =
           (ZmqReqRep *)
           std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0xe15fea);
      in_stack_fffffffffffffef4 = 0;
      in_stack_fffffffffffffee8 = (DataManSerializer *)local_88;
      std::
      function<bool_(int,_nlohmann::detail::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
      ::function(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::parse<char*>((char **)i,(parser_callback_t *)in_stack_fffffffffffffff0,
                     (bool)in_stack_ffffffffffffffef,(bool)in_stack_ffffffffffffffee);
      std::
      function<bool_(int,_nlohmann::detail::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
      ::~function((function<bool_(int,_nlohmann::detail::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
                   *)0xe1603f);
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::operator[]<char_const>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)in_stack_ffffffffffffff90.object,in_stack_ffffffffffffff88);
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::get<long,long>((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)in_stack_fffffffffffffec0);
      std::__atomic_base<long>::operator=
                ((__atomic_base<long> *)in_stack_fffffffffffffed0,
                 (__int_type_conflict)in_stack_fffffffffffffec8);
      local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)in_stack_fffffffffffffec0);
    }
    else {
LAB_00e16334:
      local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    }
    std::shared_ptr<std::vector<char,_std::allocator<char>_>_>::~shared_ptr
              ((shared_ptr<std::vector<char,_std::allocator<char>_>_> *)0xe1634c);
    std::__cxx11::string::~string(local_28);
    if (local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ != 0) {
      return;
    }
  } while( true );
}

Assistant:

void DataManReader::RequestThread()
{
    while (m_RequesterThreadActive)
    {
        std::string request = "Step";
        auto buffer = m_Requester.Request(request.data(), request.size());
        if (buffer != nullptr && buffer->size() > 0)
        {
            if (buffer->size() < 64)
            {
                try
                {
                    auto jmsg = nlohmann::json::parse(buffer->data());
                    m_FinalStep = jmsg["FinalStep"].get<int64_t>();
                    return;
                }
                catch (...)
                {
                }
            }
            m_Serializer.PutPack(buffer, m_Threading);
            if (m_MonitorActive)
            {
                size_t combiningSteps = m_Serializer.GetCombiningSteps();
                m_Monitor.SetCombiningSteps(combiningSteps);
                if (combiningSteps < 20)
                {
                    m_Monitor.SetAverageSteps(40);
                }
                else
                {
                    m_Monitor.SetAverageSteps(combiningSteps * 2);
                }
                auto timeStamps = m_Serializer.GetTimeStamps();
                for (const auto &timeStamp : timeStamps)
                {
                    m_Monitor.AddLatencyMilliseconds(timeStamp);
                }
            }
        }
    }
}